

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saving.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int i;
  _Head_base<0UL,_int,_false> _Var2;
  undefined4 in_register_0000003c;
  thread_group threads;
  _Bind<void_(*(int))(int)> local_180;
  thread_group local_170;
  
  Py_Initialize(CONCAT44(in_register_0000003c,argc));
  PyEval_InitThreads();
  uVar1 = PyGILState_GetThisThreadState();
  PyEval_ReleaseThread(uVar1);
  boost::thread_group::thread_group(&local_170);
  for (_Var2._M_head_impl = 0; _Var2._M_head_impl != 100;
      _Var2._M_head_impl = _Var2._M_head_impl + 1) {
    local_180._M_f = CallCommandFunc;
    local_180._M_bound_args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_int>)(_Tuple_impl<0UL,_int>)_Var2._M_head_impl;
    boost::thread_group::create_thread<std::_Bind<void(*(int))(int)>>(&local_170,&local_180);
  }
  boost::thread_group::join_all(&local_170);
  PyGILState_Ensure();
  Py_Finalize();
  boost::thread_group::~thread_group(&local_170);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
    // Step 1: Initialize Python and enable thread support
    //
    // @note: It's important to ensure this is completed in the main thread of the application.
	Py_Initialize();
	PyEval_InitThreads();
	
    // Step 2: Release the GIL from the main thread so that other threads can use it
    PyEval_ReleaseThread(PyGILState_GetThisThreadState());
    
    // Step 3: Turn over to application processing
    boost::thread_group threads;
    for (int i = 0; i < 100; ++i)
    {
        threads.create_thread(std::bind(CallCommandFunc, i));
    }

    threads.join_all();
    
    // Step 4: Lock the GIL before calling finalize
    PyGILState_Ensure();
    Py_Finalize();

	return 0;
}